

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall wasm::EffectAnalyzer::EffectAnalyzer(EffectAnalyzer *this,EffectAnalyzer *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Module *pMVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined4 uVar16;
  
  bVar4 = param_1->trapsNeverHappen;
  this->ignoreImplicitTraps = param_1->ignoreImplicitTraps;
  this->trapsNeverHappen = bVar4;
  (this->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (param_1->funcEffectsMap).
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (param_1->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->funcEffectsMap).
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  pMVar2 = param_1->module;
  *(undefined8 *)((long)&this->module + 6) = *(undefined8 *)((long)&param_1->module + 6);
  this->module = pMVar2;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&(this->localsRead)._M_t,&(param_1->localsRead)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&(this->localsWritten)._M_t,&(param_1->localsWritten)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->mutableGlobalsRead)._M_t,&(param_1->mutableGlobalsRead)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->globalsWritten)._M_t,&(param_1->globalsWritten)._M_t);
  this->danglingPop = param_1->danglingPop;
  bVar4 = param_1->readsMemory;
  bVar5 = param_1->writesMemory;
  bVar6 = param_1->readsTable;
  bVar7 = param_1->writesTable;
  bVar8 = param_1->readsMutableStruct;
  bVar9 = param_1->writesStruct;
  bVar10 = param_1->readsArray;
  bVar11 = param_1->writesArray;
  bVar12 = param_1->trap;
  bVar13 = param_1->implicitTrap;
  bVar14 = param_1->isAtomic;
  bVar15 = param_1->throws_;
  uVar16 = *(undefined4 *)&param_1->field_0xf4;
  sVar3 = param_1->catchDepth;
  this->tryDepth = param_1->tryDepth;
  this->catchDepth = sVar3;
  this->readsMemory = bVar4;
  this->writesMemory = bVar5;
  this->readsTable = bVar6;
  this->writesTable = bVar7;
  this->readsMutableStruct = bVar8;
  this->writesStruct = bVar9;
  this->readsArray = bVar10;
  this->writesArray = bVar11;
  this->trap = bVar12;
  this->implicitTrap = bVar13;
  this->isAtomic = bVar14;
  this->throws_ = bVar15;
  *(undefined4 *)&this->field_0xf4 = uVar16;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->breakTargets)._M_t,&(param_1->breakTargets)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->delegateTargets)._M_t,&(param_1->delegateTargets)._M_t);
  return;
}

Assistant:

EffectAnalyzer(const PassOptions& passOptions, Module& module)
    : ignoreImplicitTraps(passOptions.ignoreImplicitTraps),
      trapsNeverHappen(passOptions.trapsNeverHappen),
      funcEffectsMap(passOptions.funcEffectsMap), module(module),
      features(module.features) {}